

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitterSystem.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::EmitterSystem::Encode(EmitterSystem *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  EmitterSystem *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,this->m_ui16EmitterName);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8Function);
  KDataStream::operator<<(pKVar1,this->m_ui8EmitterIDNumber);
  return;
}

Assistant:

void EmitterSystem::Encode( KDataStream & stream ) const
{
    stream << m_ui16EmitterName
           << m_ui8Function
           << m_ui8EmitterIDNumber;
}